

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneTest::createMultisampleTestInstance
          (AlphaToOneTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  Context *pCVar1;
  _func_int **pp_Var2;
  Context *pCVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  TestInstance *pTVar6;
  InstanceInterface *pIVar7;
  VkPhysicalDevice pVVar8;
  NotSupportedError *this_00;
  VkPhysicalDeviceFeatures deviceFeatures;
  string local_130;
  undefined1 local_10c [68];
  int local_c8;
  
  pTVar6 = (TestInstance *)operator_new(0x88);
  pTVar6->m_context = context;
  pTVar6->_vptr_TestInstance = (_func_int **)&PTR__AlphaToOneInstance_00cf3470;
  pTVar6[1]._vptr_TestInstance = (_func_int **)0x2000000025;
  *(undefined4 *)&pTVar6[1].m_context = 0x20;
  *(VkPrimitiveTopology *)((long)&pTVar6[1].m_context + 4) = topology;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
             (pTVar6 + 2),vertices);
  pCVar1 = *(Context **)multisampleStateParams;
  pp_Var2 = (_func_int **)multisampleStateParams->pNext;
  pCVar3 = *(Context **)&multisampleStateParams->flags;
  pp_Var4 = *(_func_int ***)&multisampleStateParams->sampleShadingEnable;
  pp_Var5 = *(_func_int ***)&multisampleStateParams->alphaToCoverageEnable;
  pTVar6[5].m_context = (Context *)multisampleStateParams->pSampleMask;
  pTVar6[6]._vptr_TestInstance = pp_Var5;
  pTVar6[4].m_context = pCVar3;
  pTVar6[5]._vptr_TestInstance = pp_Var4;
  pTVar6[3].m_context = pCVar1;
  pTVar6[4]._vptr_TestInstance = pp_Var2;
  pp_Var2 = *(_func_int ***)&colorBlendState->dstColorBlendFactor;
  pCVar1 = *(Context **)&colorBlendState->srcAlphaBlendFactor;
  pp_Var4 = *(_func_int ***)&colorBlendState->alphaBlendOp;
  pTVar6[6].m_context = *(Context **)colorBlendState;
  pTVar6[7]._vptr_TestInstance = pp_Var2;
  pTVar6[7].m_context = pCVar1;
  pTVar6[8]._vptr_TestInstance = pp_Var4;
  pIVar7 = Context::getInstanceInterface(context);
  pVVar8 = Context::getPhysicalDevice(context);
  (*pIVar7->_vptr_InstanceInterface[2])(pIVar7,pVVar8,local_10c);
  if (local_c8 != 0) {
    return pTVar6;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"Alpha-to-one is not supported","");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_130);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* AlphaToOneTest::createMultisampleTestInstance (Context&										context,
															 VkPrimitiveTopology							topology,
															 const std::vector<Vertex4RGBA>&				vertices,
															 const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
															 const VkPipelineColorBlendAttachmentState&		colorBlendState) const
{
	return new AlphaToOneInstance(context, topology, vertices, multisampleStateParams, colorBlendState);
}